

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_disk_posix.c
# Opt level: O0

wchar_t set_times_from_entry(archive_write_disk *a)

{
  wchar_t wVar1;
  long local_70;
  long ctime_nsec;
  long mtime_nsec;
  long birthtime_nsec;
  long atime_nsec;
  time_t cctime;
  time_t mtime;
  time_t birthtime;
  time_t atime;
  archive_write_disk *a_local;
  
  atime_nsec = a->start_time;
  local_70 = 0;
  ctime_nsec = 0;
  mtime_nsec = 0;
  birthtime_nsec = 0;
  wVar1 = archive_entry_atime_is_set(a->entry);
  if ((wVar1 == L'\0') && (wVar1 = archive_entry_mtime_is_set(a->entry), wVar1 == L'\0')) {
    return L'\0';
  }
  wVar1 = archive_entry_atime_is_set(a->entry);
  birthtime = atime_nsec;
  if (wVar1 != L'\0') {
    birthtime = archive_entry_atime(a->entry);
    birthtime_nsec = archive_entry_atime_nsec(a->entry);
  }
  wVar1 = archive_entry_birthtime_is_set(a->entry);
  mtime = atime_nsec;
  if (wVar1 != L'\0') {
    mtime = archive_entry_birthtime(a->entry);
    mtime_nsec = archive_entry_birthtime_nsec(a->entry);
  }
  wVar1 = archive_entry_mtime_is_set(a->entry);
  cctime = atime_nsec;
  if (wVar1 != L'\0') {
    cctime = archive_entry_mtime(a->entry);
    ctime_nsec = archive_entry_mtime_nsec(a->entry);
  }
  wVar1 = archive_entry_ctime_is_set(a->entry);
  if (wVar1 != L'\0') {
    atime_nsec = archive_entry_ctime(a->entry);
    local_70 = archive_entry_ctime_nsec(a->entry);
  }
  wVar1 = set_times(a,a->fd,a->mode,a->name,birthtime,birthtime_nsec,mtime,mtime_nsec,cctime,
                    ctime_nsec,atime_nsec,local_70);
  return wVar1;
}

Assistant:

static int
set_times_from_entry(struct archive_write_disk *a)
{
	time_t atime, birthtime, mtime, cctime;
	long atime_nsec, birthtime_nsec, mtime_nsec, ctime_nsec;

	/* Suitable defaults. */
	atime = birthtime = mtime = cctime = a->start_time;
	atime_nsec = birthtime_nsec = mtime_nsec = ctime_nsec = 0;

	/* If no time was provided, we're done. */
	if (!archive_entry_atime_is_set(a->entry)
#if HAVE_STRUCT_STAT_ST_BIRTHTIME
	    && !archive_entry_birthtime_is_set(a->entry)
#endif
	    && !archive_entry_mtime_is_set(a->entry))
		return (ARCHIVE_OK);

	if (archive_entry_atime_is_set(a->entry)) {
		atime = archive_entry_atime(a->entry);
		atime_nsec = archive_entry_atime_nsec(a->entry);
	}
	if (archive_entry_birthtime_is_set(a->entry)) {
		birthtime = archive_entry_birthtime(a->entry);
		birthtime_nsec = archive_entry_birthtime_nsec(a->entry);
	}
	if (archive_entry_mtime_is_set(a->entry)) {
		mtime = archive_entry_mtime(a->entry);
		mtime_nsec = archive_entry_mtime_nsec(a->entry);
	}
	if (archive_entry_ctime_is_set(a->entry)) {
		cctime = archive_entry_ctime(a->entry);
		ctime_nsec = archive_entry_ctime_nsec(a->entry);
	}

	return set_times(a, a->fd, a->mode, a->name,
			 atime, atime_nsec,
			 birthtime, birthtime_nsec,
			 mtime, mtime_nsec,
			 cctime, ctime_nsec);
}